

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O0

void __thiscall czh::node::Node::NodeData::NodeData(NodeData *this,NodeData *nd)

{
  bool bVar1;
  allocator<char> local_139;
  string local_138;
  Node local_108;
  int local_3c;
  reference pNStack_38;
  int e;
  Node *r;
  const_iterator __end3;
  const_iterator __begin3;
  list<czh::node::Node,_std::allocator<czh::node::Node>_> *__range3;
  NodeData *nd_local;
  NodeData *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<czh::node::Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_List_iterator<czh::node::Node>_>_>_>
  ::map(&this->index);
  std::__cxx11::list<czh::node::Node,_std::allocator<czh::node::Node>_>::list(&this->nodes);
  __end3 = std::__cxx11::list<czh::node::Node,_std::allocator<czh::node::Node>_>::begin(&nd->nodes);
  r = (Node *)std::__cxx11::list<czh::node::Node,_std::allocator<czh::node::Node>_>::end(&nd->nodes)
  ;
  while( true ) {
    bVar1 = std::operator==(&__end3,(_Self *)&r);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pNStack_38 = std::_List_const_iterator<czh::node::Node>::operator*(&__end3);
    Node(&local_108,pNStack_38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_139);
    add(this,&local_108,&local_138,&local_3c);
    std::__cxx11::string::~string((string *)&local_138);
    std::allocator<char>::~allocator(&local_139);
    ~Node(&local_108);
    std::_List_const_iterator<czh::node::Node>::operator++(&__end3);
  }
  return;
}

Assistant:

NodeData(const NodeData &nd)
      {
        for (auto &r: nd.nodes)
        {
          int e;
          add(Node(r), "", e);
        }
      }